

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

string * Omega_h::remove_trailing_whitespace(string *in)

{
  char cVar1;
  string *psVar2;
  size_type sVar3;
  ulong in_RDI;
  
  sVar3 = in->_M_string_length;
  if (sVar3 != 0) {
    do {
      cVar1 = (in->_M_dataplus)._M_p[sVar3 - 1];
      if ((cVar1 != ' ') && (cVar1 != '\t')) break;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  psVar2 = (string *)std::__cxx11::string::substr(in_RDI,(ulong)in);
  return psVar2;
}

Assistant:

static std::string remove_trailing_whitespace(std::string const& in) {
  std::size_t new_end = 0;
  for (std::size_t ri = 0; ri < in.size(); ++ri) {
    std::size_t i = in.size() - 1 - ri;
    if (in[i] != ' ' && in[i] != '\t') {
      new_end = i + 1;
      break;
    }
  }
  return in.substr(0, new_end);
}